

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.h
# Opt level: O2

int hanabi_learning_env::anon_unknown_4::LastActionSectionLength(HanabiGame *game)

{
  return game->num_colors_ + game->num_ranks_ + game->num_ranks_ * game->num_colors_ +
         (game->hand_size_ + game->num_players_) * 2 + 6;
}

Assistant:

int HandSize() const { return hand_size_; }